

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O3

bool __thiscall
S2BooleanOperation::Impl::CrossingProcessor::PolylineEdgeContainsVertex
          (CrossingProcessor *this,S2Point *v,CrossingIterator *it)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  ChainInfo *pCVar4;
  long lVar5;
  double *ap;
  bool bVar6;
  S2LogMessage local_a0;
  double adStack_88 [3];
  S2LogMessage local_70;
  undefined1 local_60 [24];
  double adStack_48 [3];
  
  if (it->b_dimension_ != 1) {
    S2LogMessage::S2LogMessage
              (&local_a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
               ,0x687,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_a0.stream_,"Check failed: (1) == (it.b_dimension()) ",0x28);
LAB_0019dd54:
    abort();
  }
  (*it->b_shape_->_vptr_S2Shape[3])
            (&local_a0,it->b_shape_,(ulong)(uint)(((it->it_)._M_current)->b).edge_id);
  lVar5 = 0;
  do {
    dVar1 = *(double *)((long)&local_a0.severity_ + lVar5);
    dVar2 = *(double *)((long)v->c_ + lVar5);
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
    bVar6 = lVar5 != 0x10;
    lVar5 = lVar5 + 8;
  } while (bVar6);
  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
    (*it->b_shape_->_vptr_S2Shape[3])
              (local_60,it->b_shape_,(ulong)(uint)(((it->it_)._M_current)->b).edge_id);
    lVar5 = 0;
    do {
      dVar1 = *(double *)((long)adStack_48 + lVar5);
      dVar2 = *(double *)((long)v->c_ + lVar5);
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
      bVar6 = lVar5 != 0x10;
      lVar5 = lVar5 + 8;
    } while (bVar6);
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
      S2LogMessage::S2LogMessage
                (&local_70,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                 ,0x688,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_70.stream_,"Check failed: it.b_edge().v0 == v || it.b_edge().v1 == v ",0x39);
      goto LAB_0019dd54;
    }
  }
  if (this->polyline_model_ == CLOSED) {
    return true;
  }
  pCVar4 = CrossingIterator::b_chain_info(it);
  uVar3 = (((it->it_)._M_current)->b).edge_id;
  if (pCVar4->limit - 1U == uVar3) {
    (*it->b_shape_->_vptr_S2Shape[3])(&local_a0,it->b_shape_,(ulong)uVar3);
    lVar5 = 0;
    do {
      dVar1 = *(double *)((long)v->c_ + lVar5);
      dVar2 = *(double *)((long)adStack_88 + lVar5);
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
      bVar6 = lVar5 != 0x10;
      lVar5 = lVar5 + 8;
    } while (bVar6);
    if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
      return false;
    }
  }
  if (pCVar4->start < (int)uVar3) {
    return true;
  }
  if (this->polyline_model_ != OPEN) {
    return true;
  }
  (*it->b_shape_->_vptr_S2Shape[3])
            (&local_a0,it->b_shape_,(ulong)(uint)(((it->it_)._M_current)->b).edge_id);
  lVar5 = 0;
  do {
    dVar1 = *(double *)((long)v->c_ + lVar5);
    dVar2 = *(double *)((long)&local_a0.severity_ + lVar5);
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
    bVar6 = lVar5 != 0x10;
    lVar5 = lVar5 + 8;
  } while (bVar6);
  if (dVar1 != dVar2) {
    return true;
  }
  if (NAN(dVar1) || NAN(dVar2)) {
    return true;
  }
  if (this->polyline_loops_have_boundaries_ != false) {
    return false;
  }
  (*it->b_shape_->_vptr_S2Shape[8])
            (&local_a0,it->b_shape_,(ulong)(uint)pCVar4->chain_id,
             (ulong)(uint)(~pCVar4->start + pCVar4->limit));
  lVar5 = 0;
  do {
    dVar1 = *(double *)((long)v->c_ + lVar5);
    dVar2 = *(double *)((long)adStack_88 + lVar5);
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
    bVar6 = lVar5 != 0x10;
    lVar5 = lVar5 + 8;
  } while (bVar6);
  return (bool)(-(dVar1 == dVar2) & 1);
}

Assistant:

bool S2BooleanOperation::Impl::CrossingProcessor::PolylineEdgeContainsVertex(
    const S2Point& v, const CrossingIterator& it) const {
  S2_DCHECK_EQ(1, it.b_dimension());
  S2_DCHECK(it.b_edge().v0 == v || it.b_edge().v1 == v);

  // Closed polylines contain all their vertices.
  if (polyline_model_ == PolylineModel::CLOSED) return true;

  // Note that the code below is structured so that it.b_edge() is not usually
  // needed (since accessing the edge can be relatively expensive).
  const auto& b_chain = it.b_chain_info();
  int b_edge_id = it.b_edge_id();

  // The last polyline vertex is never contained.  (For polyline loops, it is
  // sufficient to treat the first vertex as begin contained.)  This case also
  // handles degenerate polylines (polylines with one edge where v0 == v1),
  // which do not contain any points.
  if (b_edge_id == b_chain.limit - 1 && v == it.b_edge().v1) return false;

  // Otherwise all interior vertices are contained.  The first polyline
  // vertex is contained if either the polyline model is not OPEN, or the
  // polyline forms a loop and polyline_loops_have_boundaries_ is false.
  if (polyline_contains_v0(b_edge_id, b_chain.start)) return true;
  if (v != it.b_edge().v0) return true;
  if (polyline_loops_have_boundaries_) return false;
  return v == it.b_shape().chain_edge(b_chain.chain_id,
                                      b_chain.limit - b_chain.start - 1).v1;
}